

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMachine.cpp
# Opt level: O2

StackMachineModule<long> *
calc4::GenerateStackMachineModule<long>
          (StackMachineModule<long> *__return_storage_ptr__,shared_ptr<const_calc4::Operator> *op,
          CompilationContext *context,StackMachineCodeGenerationOption *option)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  AssertionErrorException *this;
  int iVar4;
  _Self __tmp;
  __node_base *p_Var5;
  string_view message;
  vector<long,_std::allocator<long>_> constTable;
  vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_> entryPoint;
  vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  userDefinedOperators;
  _Storage<calc4::OperatorDefinition,_false> local_170;
  undefined1 local_148;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  variableIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_> local_a8;
  int local_8c;
  int local_88 [2];
  unordered_map<calc4::OperatorDefinition,_int,_std::hash<calc4::OperatorDefinition>,_std::equal_to<calc4::OperatorDefinition>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>_>
  operatorLabels;
  optional<calc4::CharPosition> local_48;
  
  constTable.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  constTable.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  constTable.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  userDefinedOperators.
  super__Vector_base<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  userDefinedOperators.
  super__Vector_base<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  userDefinedOperators.
  super__Vector_base<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  operatorLabels._M_h._M_buckets = &operatorLabels._M_h._M_single_bucket;
  operatorLabels._M_h._M_bucket_count = 1;
  operatorLabels._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  operatorLabels._M_h._M_element_count = 0;
  operatorLabels._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  operatorLabels._M_h._M_rehash_policy._M_next_resize = 0;
  operatorLabels._M_h._M_single_bucket = (__node_base_ptr)0x0;
  variableIndices._M_h._M_buckets = &variableIndices._M_h._M_single_bucket;
  variableIndices._M_h._M_bucket_count = 1;
  p_Var5 = &variableIndices._M_h._M_before_begin;
  variableIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  variableIndices._M_h._M_element_count = 0;
  variableIndices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  variableIndices._M_h._M_rehash_policy._M_next_resize = 0;
  variableIndices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header;
  iVar4 = 0;
  for (p_Var3 = (context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ; (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    pmVar2 = std::__detail::
             _Map_base<calc4::OperatorDefinition,_std::pair<const_calc4::OperatorDefinition,_int>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>,_std::__detail::_Select1st,_std::equal_to<calc4::OperatorDefinition>,_std::hash<calc4::OperatorDefinition>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<calc4::OperatorDefinition,_std::pair<const_calc4::OperatorDefinition,_int>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>,_std::__detail::_Select1st,_std::equal_to<calc4::OperatorDefinition>,_std::hash<calc4::OperatorDefinition>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&operatorLabels,(key_type *)(p_Var3 + 2));
    *pmVar2 = iVar4;
    iVar4 = iVar4 + 1;
  }
  p_Var3 = (context->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      entryPoint.
      super__Vector_base<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entryPoint.
      super__Vector_base<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entryPoint.
      super__Vector_base<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148 = 0;
      GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
      CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
      Generator(calc4::CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&,std
      ::vector<long,std::allocator<long>>&,std::unordered_map<calc4::OperatorDefinition,int,std::
      hash<calc4::OperatorDefinition>,std::equal_to<calc4::OperatorDefinition>,std::allocator<std::
      pair<calc4::OperatorDefinition_const,int>>>&,std::optional<calc4::
      OperatorDefinition>const&,std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::
      string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::
      string_const_int>_>_>__
                (&variables,context,option,&constTable,&operatorLabels,
                 (optional<calc4::OperatorDefinition> *)&local_170._M_value,&variableIndices);
      std::_Optional_payload_base<calc4::OperatorDefinition>::_M_reset
                ((_Optional_payload_base<calc4::OperatorDefinition> *)&local_170._M_value);
      GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
      CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
      Generate(std::shared_ptr<calc4::Operator_const>_const__(&variables,op);
      std::vector<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>::
      _M_move_assign(&entryPoint,&local_a8);
      GenerateStackMachineModule<long>::Generator::~Generator((Generator *)&variables);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&variables,variableIndices._M_h._M_element_count,
               (allocator_type *)&local_170._M_value);
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   (variables.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(int *)&p_Var5[5]._M_nxt));
      }
      StackMachineModule<long>::StackMachineModule
                (__return_storage_ptr__,&entryPoint,&constTable,&userDefinedOperators,&variables);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&variables);
      std::_Vector_base<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
      ::~_Vector_base(&entryPoint.
                       super__Vector_base<calc4::StackMachineOperation,_std::allocator<calc4::StackMachineOperation>_>
                     );
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&variableIndices._M_h);
      std::
      _Hashtable<calc4::OperatorDefinition,_std::pair<const_calc4::OperatorDefinition,_int>,_std::allocator<std::pair<const_calc4::OperatorDefinition,_int>_>,_std::__detail::_Select1st,_std::equal_to<calc4::OperatorDefinition>,_std::hash<calc4::OperatorDefinition>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&operatorLabels._M_h);
      std::
      vector<calc4::StackMachineUserDefinedOperator,_std::allocator<calc4::StackMachineUserDefinedOperator>_>
      ::~vector(&userDefinedOperators);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&constTable.super__Vector_base<long,_std::allocator<long>_>);
      return __return_storage_ptr__;
    }
    std::_Optional_payload_base<calc4::OperatorDefinition>::
    _Optional_payload_base<calc4::OperatorDefinition_const&>
              ((_Optional_payload_base<calc4::OperatorDefinition> *)&local_170,
               (OperatorDefinition *)(p_Var3 + 2));
    GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
    CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
    Generator(calc4::CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&,std::
    vector<long,std::allocator<long>>&,std::unordered_map<calc4::OperatorDefinition,int,std::
    hash<calc4::OperatorDefinition>,std::equal_to<calc4::OperatorDefinition>,std::allocator<std::
    pair<calc4::OperatorDefinition_const,int>>>&,std::optional<calc4::OperatorDefinition>const&,std
    ::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::
    __cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const_int>_>_>__
              ((Generator *)&variables,context,option,&constTable,&operatorLabels,
               (optional<calc4::OperatorDefinition> *)&local_170._M_value,&variableIndices);
    std::_Optional_payload_base<calc4::OperatorDefinition>::_M_reset
              ((_Optional_payload_base<calc4::OperatorDefinition> *)&local_170._M_value);
    GenerateStackMachineModule<long>(std::shared_ptr<calc4::Operator_const>const&,calc4::
    CompilationContext_const&,calc4::StackMachineCodeGenerationOption_const&)::Generator::
    Generate(std::shared_ptr<calc4::Operator_const>_const__
              ((Generator *)&variables,(shared_ptr<const_calc4::Operator> *)&p_Var3[3]._M_parent);
    if (local_8c != 0) break;
    std::
    vector<calc4::StackMachineUserDefinedOperator,std::allocator<calc4::StackMachineUserDefinedOperator>>
    ::
    emplace_back<calc4::OperatorDefinition_const&,std::vector<calc4::StackMachineOperation,std::allocator<calc4::StackMachineOperation>>,int&>
              ((vector<calc4::StackMachineUserDefinedOperator,std::allocator<calc4::StackMachineUserDefinedOperator>>
                *)&userDefinedOperators,(OperatorDefinition *)(p_Var3 + 2),&local_a8,local_88);
    GenerateStackMachineModule<long>::Generator::~Generator((Generator *)&variables);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  }
  this = (AssertionErrorException *)__cxa_allocate_exception(0x40);
  local_48.super__Optional_base<calc4::CharPosition,_true,_true>._M_payload.
  super__Optional_payload_base<calc4::CharPosition>._M_engaged = false;
  std::__cxx11::to_string((string *)&entryPoint,local_8c);
  std::operator+(&local_170._M_value.name,"Stacksize is not zero: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entryPoint);
  message._M_str = (char *)local_170._M_value.name._M_dataplus._M_p;
  message._M_len = local_170._M_value.name._M_string_length;
  Exceptions::AssertionErrorException::AssertionErrorException(this,&local_48,message);
  __cxa_throw(this,&Exceptions::AssertionErrorException::typeinfo,
              Exceptions::Calc4Exception::~Calc4Exception);
}

Assistant:

StackMachineModule<TNumber> GenerateStackMachineModule(
    const std::shared_ptr<const Operator>& op, const CompilationContext& context,
    const StackMachineCodeGenerationOption& option)
{
    static constexpr int OperatorBeginLabel = 0;

    class Generator : public OperatorVisitor
    {
    public:
        const CompilationContext& context;
        StackMachineCodeGenerationOption option;
        std::vector<TNumber>& constTable;
        std::unordered_map<OperatorDefinition, int>& operatorLabels;
        std::optional<OperatorDefinition> definition;
        std::unordered_map<std::string, int>& variableIndices;

        std::vector<StackMachineOperation> operations;
        int nextLabel = OperatorBeginLabel;
        int stackSize = 0;
        int maxStackSize = 0;

        Generator(const CompilationContext& context, const StackMachineCodeGenerationOption& option,
                  std::vector<TNumber>& constTable,
                  std::unordered_map<OperatorDefinition, int>& operatorLabels,
                  const std::optional<OperatorDefinition>& definition,
                  std::unordered_map<std::string, int>& variableIndices)
            : context(context), option(option), constTable(constTable),
              operatorLabels(operatorLabels), definition(definition),
              variableIndices(variableIndices)
        {
        }

        void Generate(const std::shared_ptr<const Operator>& op)
        {
            assert(nextLabel == OperatorBeginLabel);
            AddOperation(StackMachineOpcode::Lavel, nextLabel++);

            if (definition)
            {
                // Generate user-defined operators' codes
                op->Accept(*this);
                AddOperation(StackMachineOpcode::Return, definition.value().GetNumOperands());
            }
            else
            {
                // Generate Main code
                op->Accept(*this);
                AddOperation(StackMachineOpcode::Halt);
            }

            ResolveLabels();
        }

        void ResolveLabels()
        {
            std::vector<StackMachineOperation> newVector;
            std::unordered_map<int, int> labelMap;

            for (auto& operation : operations)
            {
                switch (operation.opcode)
                {
                case StackMachineOpcode::Lavel:
                {
                    int label = static_cast<int>(newVector.size());
                    labelMap[operation.value] = label;
                    break;
                }
                default:
                    newVector.push_back(operation);
                    break;
                }
            }

            for (size_t i = 0; i < newVector.size(); i++)
            {
                auto& operation = newVector[i];

                switch (operation.opcode)
                {
                case StackMachineOpcode::Goto:
                case StackMachineOpcode::GotoIfTrue:
                case StackMachineOpcode::GotoIfEqual:
                case StackMachineOpcode::GotoIfLessThan:
                case StackMachineOpcode::GotoIfLessThanOrEqual:
                    operation.value = labelMap.at(operation.value);
                    break;
                default:
                    break;
                }
            }

            operations = std::move(newVector);
        }

        virtual void Visit(const std::shared_ptr<const ZeroOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadConst, 0);
        }

        virtual void Visit(const std::shared_ptr<const PrecomputedOperator>& op) override
        {
            auto value = op->GetValue<TNumber>();

            StackMachineOperation::ValueType casted;
#ifdef ENABLE_GMP
            if constexpr (std::is_same_v<TNumber, mpz_class>)
            {
                casted = static_cast<StackMachineOperation::ValueType>(value.get_si());
            }
            else
#endif // ENABLE_GMP
            {
                casted = static_cast<StackMachineOperation::ValueType>(value);
            }

            if (casted == value)
            {
                // Value fits StackMachineOperation::ValueType
                AddOperation(StackMachineOpcode::LoadConst, casted);
            }
            else
            {
                // We cannot emit Opcode.LoadConst,
                // because the constant value exceeds limit of 16-bit integer.
                // So we use constTable.
                int no = static_cast<int>(constTable.size());
                constTable.push_back(value);
                AddOperation(StackMachineOpcode::LoadConstTable, no);
            }
        }

        virtual void Visit(const std::shared_ptr<const OperandOperator>& op) override
        {
            assert(definition);
            AddOperation(StackMachineOpcode::LoadArg,
                         GetArgumentAddress(definition.value().GetNumOperands(), op->GetIndex()));
        };

        virtual void Visit(const std::shared_ptr<const DefineOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadConst, 0);
        };

        virtual void Visit(const std::shared_ptr<const LoadVariableOperator>& op) override
        {
            AddOperation(StackMachineOpcode::LoadVariable,
                         GetOrCreateVariableIndex(op->GetVariableName()));
        };

        virtual void Visit(const std::shared_ptr<const InputOperator>& op) override
        {
            AddOperation(StackMachineOpcode::Input, 0);
        };

        virtual void Visit(const std::shared_ptr<const LoadArrayOperator>& op) override
        {
            op->GetIndex()->Accept(*this);
            AddOperation(StackMachineOpcode::LoadArrayElement);
        };

        virtual void Visit(const std::shared_ptr<const PrintCharOperator>& op) override
        {
            op->GetCharacter()->Accept(*this);
            AddOperation(StackMachineOpcode::PrintChar);
        };

        virtual void Visit(const std::shared_ptr<const ParenthesisOperator>& op) override
        {
            auto& operators = op->GetOperators();

            for (size_t i = 0; i < operators.size(); i++)
            {
                operators[i]->Accept(*this);
                if (i < operators.size() - 1)
                {
                    AddOperation(StackMachineOpcode::Pop);
                }
            }
        }

        virtual void Visit(const std::shared_ptr<const DecimalOperator>& op) override
        {
            op->GetOperand()->Accept(*this);
            AddOperation(StackMachineOpcode::LoadConst, 10);
            AddOperation(StackMachineOpcode::Mult);
            AddOperation(StackMachineOpcode::LoadConst, op->GetValue());
            AddOperation(StackMachineOpcode::Add);
        }

        virtual void Visit(const std::shared_ptr<const StoreVariableOperator>& op) override
        {
            op->GetOperand()->Accept(*this);
            AddOperation(StackMachineOpcode::StoreVariable,
                         GetOrCreateVariableIndex(op->GetVariableName()));
        }

        virtual void Visit(const std::shared_ptr<const StoreArrayOperator>& op) override
        {
            op->GetValue()->Accept(*this);
            op->GetIndex()->Accept(*this);
            AddOperation(StackMachineOpcode::StoreArrayElement);
        }

        virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
        {
            auto EmitComparisonBranch = [this](StackMachineOpcode opcode, bool reverse) {
                int ifFalse = nextLabel++, end = nextLabel++;

                AddOperation(opcode, ifFalse);
                AddOperation(StackMachineOpcode::LoadConst, reverse ? 1 : 0);
                AddOperation(StackMachineOpcode::Goto, end);
                AddOperation(StackMachineOpcode::Lavel, ifFalse);
                AddOperation(StackMachineOpcode::LoadConst, reverse ? 0 : 1);
                AddOperation(StackMachineOpcode::Lavel, end);

                // StackSize increased by two due to two LoadConst operations.
                // However, only one of them will be executed.
                // We modify StackSize here.
                AddStackSize(-1);
            };

            op->GetLeft()->Accept(*this);
            op->GetRight()->Accept(*this);

            switch (op->GetType())
            {
            case BinaryType::Add:
                AddOperation(StackMachineOpcode::Add);
                break;
            case BinaryType::Sub:
                AddOperation(StackMachineOpcode::Sub);
                break;
            case BinaryType::Mult:
                AddOperation(StackMachineOpcode::Mult);
                break;
            case BinaryType::Div:
                AddOperation(option.checkZeroDivision ? StackMachineOpcode::DivChecked
                                                      : StackMachineOpcode::Div);
                break;
            case BinaryType::Mod:
                AddOperation(option.checkZeroDivision ? StackMachineOpcode::ModChecked
                                                      : StackMachineOpcode::Mod);
                break;
            case BinaryType::Equal:
                EmitComparisonBranch(StackMachineOpcode::GotoIfEqual, false);
                break;
            case BinaryType::NotEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfEqual, true);
                break;
            case BinaryType::LessThan:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThan, false);
                break;
            case BinaryType::LessThanOrEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThanOrEqual, false);
                break;
            case BinaryType::GreaterThanOrEqual:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThan, true);
                break;
            case BinaryType::GreaterThan:
                EmitComparisonBranch(StackMachineOpcode::GotoIfLessThanOrEqual, true);
                break;
            default:
                UNREACHABLE();
                break;
            }
        }

        virtual void Visit(const std::shared_ptr<const ConditionalOperator>& op) override
        {
            int ifTrueLabel = nextLabel++, endLabel = nextLabel++;

            // Helper function to emit code for branch
            // - Call this after generating evaluation code of condition operator
            auto Emit = [this, ifTrueLabel,
                         endLabel](StackMachineOpcode opcode,
                                   const std::shared_ptr<const Operator>& ifTrue,
                                   const std::shared_ptr<const Operator>& ifFalse) {
                AddOperation(opcode, ifTrueLabel);

                int savedStackSize = stackSize;
                ifFalse->Accept(*this);

                auto lastOperation =
                    std::find_if(operations.rbegin(), operations.rend(),
                                 [](auto op) { return op.opcode != StackMachineOpcode::Lavel; });
                if (lastOperation != operations.rend() &&
                    lastOperation->opcode != StackMachineOpcode::Goto)
                {
                    // "Last opcode is Goto" means elimination of "Call" (tail-call)
                    AddOperation(StackMachineOpcode::Goto, endLabel);
                }

                AddOperation(StackMachineOpcode::Lavel, ifTrueLabel);
                stackSize = savedStackSize;
                ifTrue->Accept(*this);
                AddOperation(StackMachineOpcode::Lavel, endLabel);
            };

            if (auto* binary = dynamic_cast<const BinaryOperator*>(op->GetCondition().get()))
            {
                // Special optimiztion for comparisons
                switch (binary->GetType())
                {
                case BinaryType::Equal:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfEqual, op->GetIfTrue(), op->GetIfFalse());
                    return;
                case BinaryType::NotEqual:
                    // "a != b ? c ? d" is equivalent to "a == b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfEqual, op->GetIfFalse(), op->GetIfTrue());
                    return;
                case BinaryType::LessThan:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThan, op->GetIfTrue(), op->GetIfFalse());
                    return;
                case BinaryType::LessThanOrEqual:
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThanOrEqual, op->GetIfTrue(),
                         op->GetIfFalse());
                    return;
                case BinaryType::GreaterThanOrEqual:
                    // "a >= b ? c ? d" is equivalent to "a < b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThan, op->GetIfFalse(), op->GetIfTrue());
                    return;
                case BinaryType::GreaterThan:
                    // "a > b ? c ? d" is equivalent to "a <= b ? d ? c"
                    binary->GetLeft()->Accept(*this);
                    binary->GetRight()->Accept(*this);
                    Emit(StackMachineOpcode::GotoIfLessThanOrEqual, op->GetIfFalse(),
                         op->GetIfTrue());
                    return;
                default:
                    break;
                }
            }

            op->GetCondition()->Accept(*this);
            Emit(StackMachineOpcode::GotoIfTrue, op->GetIfTrue(), op->GetIfFalse());
        };

        virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
        {
            auto operands = op->GetOperands();
            for (size_t i = 0; i < operands.size(); i++)
            {
                operands[i]->Accept(*this);
            }

            if (IsReplaceableWithJump(op))
            {
                for (int i = static_cast<int>(operands.size()) - 1; i >= 0; i--)
                {
                    AddOperation(StackMachineOpcode::StoreArg,
                                 GetArgumentAddress(definition.value().GetNumOperands(), i));
                }

                AddOperation(StackMachineOpcode::Goto, OperatorBeginLabel);

                // If we eliminate tail-call, there are no values left in the stack.
                // We treat as if there are one returning value in the stack.
                AddStackSize(1);
            }
            else
            {
                AddOperation(StackMachineOpcode::Call, operatorLabels[op->GetDefinition()]);
            }
        }

        void AddStackSize(int value)
        {
            int newStackSize = stackSize + value;
            if (newStackSize < 0)
            {
                throw Exceptions::AssertionErrorException(
                    std::nullopt, "Stack size is negative: " + std::to_string(newStackSize));
            }

            maxStackSize = std::max(stackSize, newStackSize);
            stackSize = newStackSize;
        }

        void AddOperation(StackMachineOpcode opcode, StackMachineOperation::ValueType value = 0)
        {
            operations.emplace_back(opcode, value);

            switch (opcode)
            {
            case StackMachineOpcode::Push:
            case StackMachineOpcode::LoadConst:
            case StackMachineOpcode::LoadConstTable:
            case StackMachineOpcode::LoadArg:
            case StackMachineOpcode::LoadVariable:
            case StackMachineOpcode::Input:
                AddStackSize(1);
                break;
            case StackMachineOpcode::Pop:
            case StackMachineOpcode::StoreArg:
            case StackMachineOpcode::StoreArrayElement:
            case StackMachineOpcode::Add:
            case StackMachineOpcode::Sub:
            case StackMachineOpcode::Mult:
            case StackMachineOpcode::Div:
            case StackMachineOpcode::DivChecked:
            case StackMachineOpcode::Mod:
            case StackMachineOpcode::ModChecked:
            case StackMachineOpcode::GotoIfTrue:
            case StackMachineOpcode::Return:
            case StackMachineOpcode::Halt:
                AddStackSize(-1);
                break;
            case StackMachineOpcode::StoreVariable:
            case StackMachineOpcode::LoadArrayElement:
            case StackMachineOpcode::PrintChar:
            case StackMachineOpcode::Goto:
                // Stacksize will not change
                break;
            case StackMachineOpcode::GotoIfEqual:
            case StackMachineOpcode::GotoIfLessThan:
            case StackMachineOpcode::GotoIfLessThanOrEqual:
                AddStackSize(-2);
                break;
            case StackMachineOpcode::Call:
            {
                // Find the corresponding OperatorDefinition
                auto it = std::find_if(operatorLabels.begin(), operatorLabels.end(),
                                       [value](auto& pair) { return pair.second == value; });
                assert(it != operatorLabels.end());

                int numOperands = it->first.GetNumOperands();
                AddStackSize(-(numOperands - 1));
                break;
            }
            case StackMachineOpcode::Lavel:
                // Do nothing
                break;
            default:
                UNREACHABLE();
                break;
            }
        }

        int GetOrCreateVariableIndex(const std::string& variableName)
        {
            auto it = variableIndices.find(variableName);
            if (it != variableIndices.end())
            {
                return it->second;
            }
            else
            {
                int index = static_cast<int>(variableIndices.size());
                variableIndices[variableName] = index;
                return index;
            }
        }

        bool IsReplaceableWithJump(const std::shared_ptr<const UserDefinedOperator>& op) const
        {
            return definition == op->GetDefinition() && op->IsTailCall().value_or(false);
        }

        static int GetArgumentAddress(int numOperands, int index)
        {
            return numOperands - index;
        }
    };

    std::vector<TNumber> constTable;
    std::vector<StackMachineUserDefinedOperator> userDefinedOperators;
    std::unordered_map<OperatorDefinition, int> operatorLabels;
    std::unordered_map<std::string, int> variableIndices;

    int index = 0;
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        auto& implement = it->second;
        operatorLabels[implement.GetDefinition()] = index++;
    }

    // Generate user-defined operators' codes
    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        auto& implement = it->second;
        Generator generator(context, option, constTable, operatorLabels, implement.GetDefinition(),
                            variableIndices);
        generator.Generate(implement.GetOperator());

        if (generator.stackSize != 0)
        {
            throw Exceptions::AssertionErrorException(
                std::nullopt, "Stacksize is not zero: " + std::to_string(generator.stackSize));
        }

        userDefinedOperators.emplace_back(implement.GetDefinition(),
                                          std::move(generator.operations), generator.maxStackSize);
    }

    // Generate Main code
    std::vector<StackMachineOperation> entryPoint;
    {
        Generator generator(context, option, constTable, operatorLabels, std::nullopt,
                            variableIndices);
        generator.Generate(op);
        entryPoint = std::move(generator.operations);
    }

    std::vector<std::string> variables(variableIndices.size());
    for (auto& pair : variableIndices)
    {
        variables[pair.second] = pair.first;
    }

    return StackMachineModule<TNumber>(entryPoint, constTable, userDefinedOperators, variables);
}